

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_matrix.cpp
# Opt level: O2

uint __thiscall
ON_SubDSectorType::GetSurfaceEvaluationCoefficients
          (ON_SubDSectorType *this,double *LP,size_t LP_capacity,double *L1,size_t L1_capacity,
          double *L2,size_t L2_capacity)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  ON_SubDVertexTag OVar4;
  bool bVar5;
  uint i_1;
  uint N;
  uint n;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  double *pdVar10;
  long lVar11;
  double *pdVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  double *pdVar16;
  long lVar17;
  ulong uVar18;
  double *pdVar19;
  uint i_5;
  double dVar20;
  undefined8 uVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  double dVar27;
  long lVar28;
  double *local_108;
  double **local_f0;
  double sin1;
  double local_d8;
  undefined8 uStack_d0;
  double cos1;
  double *eigenvectors [2];
  double eigenprecision [2];
  double eigenpivots [3];
  ON_Matrix Sbuffer;
  
  dVar20 = SubdominantEigenvalue(this);
  if (((dVar20 <= 0.0) || (1.0 <= dVar20)) || (local_d8 = dVar20, N = PointRingCount(this), N < 3))
  goto LAB_00620545;
  uVar18 = (ulong)N;
  n = FaceCount(this);
  if (n == 0) goto LAB_00620545;
  if (LP_capacity == 0) {
    LP = (double *)0x0;
  }
  else if (LP == (double *)0x0 || LP_capacity < uVar18) goto LAB_00620545;
  if (L1_capacity == 0) {
    L1 = (double *)0x0;
    if (L2_capacity != 0) goto LAB_006205ca;
    bVar3 = true;
    local_108 = (double *)0x0;
  }
  else {
    if ((L1 == (double *)0x0 || L1_capacity < uVar18) || (L2_capacity == 0)) goto LAB_00620545;
LAB_006205ca:
    if ((L2 == (double *)0x0 || L2_capacity < uVar18) || (L1 == (double *)0x0)) goto LAB_00620545;
    bVar3 = false;
    local_108 = L2;
  }
  OVar4 = VertexTag(this);
  if (3 < OVar4 - 1) goto LAB_00620545;
  dVar20 = (double)n;
  switch((uint)OVar4) {
  case 1:
    if ((N & 1) != 0 && 4 < N) {
      if (LP != (double *)0x0) {
        *LP = dVar20 / (dVar20 + 5.0);
        dVar20 = (dVar20 + 5.0) * dVar20;
        auVar23._8_8_ = dVar20;
        auVar23._0_8_ = dVar20;
        auVar23 = divpd(_DAT_006cca30,auVar23);
        for (uVar13 = 1; uVar13 < uVar18; uVar13 = uVar13 + 2) {
          *(undefined1 (*) [16])(LP + uVar13) = auVar23;
        }
      }
      if (bVar3) {
        return N;
      }
      if (N == 5) {
        *L1 = 0.0;
        L1[1] = 1.0;
        L1[2] = 0.0;
        L1[3] = -1.0;
        L1[4] = 0.0;
        *local_108 = 0.0;
        local_108[1] = 0.0;
        local_108[2] = 1.0;
        local_108[3] = 0.0;
        local_108[4] = -1.0;
        return 5;
      }
      ON_SubDMatrix::EvaluateCosAndSin(2,n,&cos1,&sin1);
      dVar20 = (cos1 + 3.0) * -0.125 + local_d8;
      local_d8 = 1.0;
      dVar22 = (dVar20 + dVar20) / (cos1 + 1.0);
      *L1 = 0.0;
      L1[1] = 1.0;
      *local_108 = 0.0;
      local_108[1] = 0.0;
      uVar6 = 4;
      dVar20 = 0.0;
      while( true ) {
        dVar1 = sin1;
        L1[uVar6 - 2] = (local_d8 + cos1) * dVar22;
        local_108[uVar6 - 2] = (dVar20 + sin1) * dVar22;
        if (uVar6 - N == 1) break;
        L1[uVar6 - 1] = cos1;
        local_108[uVar6 - 1] = sin1;
        local_d8 = cos1;
        uStack_d0 = 0;
        ON_SubDMatrix::EvaluateCosAndSin(uVar6,n,&cos1,&sin1);
        uVar6 = uVar6 + 2;
        dVar20 = dVar1;
      }
      return N;
    }
    break;
  case 2:
    if ((N & 1) == 0) {
      *LP = 0.6666666666666666;
      uVar13 = (ulong)(N - 1);
      LP[uVar13] = 0.16666666666666666;
      LP[1] = 0.16666666666666666;
      for (uVar8 = 3; uVar8 < uVar18; uVar8 = uVar8 + 2) {
        LP[uVar8 - 1] = 0.0;
      }
LAB_00620834:
      *L1 = 0.0;
      L1[1] = 1.0;
      dVar20 = -1.0;
      uVar8 = 2;
      uVar15 = uVar13;
      do {
        uVar9 = uVar8;
        L1[uVar15] = dVar20;
        uVar8 = uVar9 + 1;
        dVar20 = 0.0;
        uVar15 = uVar9;
      } while (uVar8 < uVar18);
      if (n == 1) {
        *local_108 = -2.0;
        local_108[1] = 1.0;
        local_108[2] = 0.0;
        local_108[3] = 1.0;
        return N;
      }
      ON_SubDMatrix::EvaluateCosAndSin(1,n,&cos1,&sin1);
      *local_108 = -sin1;
      dVar20 = (cos1 + cos1 + 1.0) * ((cos1 + 1.0) / sin1) * -0.25;
      local_108[1] = dVar20;
      local_108[2] = (sin1 + 0.0) * 0.25;
      local_108[uVar13] = dVar20;
      uVar18 = 3;
      do {
        local_d8 = sin1;
        uStack_d0 = 0;
        ON_SubDMatrix::EvaluateCosAndSin((int)(uVar18 >> 1) + 1,n,&cos1,&sin1);
        local_108[uVar18] = local_d8;
        local_108[(int)uVar18 + 1] = (local_d8 + sin1) * 0.25;
        uVar6 = (int)uVar18 + 2;
        uVar18 = (ulong)uVar6;
      } while (uVar6 < (uint)uVar13);
      return N;
    }
    break;
  case 3:
    if ((N & 1) == 0) {
      uVar6 = CornerSectorAngleIndex(this);
      *LP = 1.0;
      if (n == 1 || uVar6 != 0x24) {
        for (uVar13 = 1; uVar13 < uVar18; uVar13 = uVar13 + 2) {
          LP[uVar13] = 0.0;
        }
        *L1 = -1.0;
        L1[1] = 1.0;
        L1[N - 1] = 0.0;
        if (uVar6 * 2 < 0x49) {
          dVar20 = 1.0;
        }
        else {
          dVar20 = -1.0;
        }
        *local_108 = -dVar20;
        pdVar19 = local_108 + 1;
        uVar13 = 3;
        uVar8 = (ulong)(N - 1);
        uVar15 = 2;
        while( true ) {
          *pdVar19 = 0.0;
          local_108[uVar8] = dVar20;
          if (uVar18 <= uVar13) break;
          pdVar19 = L1 + uVar15;
          uVar13 = uVar13 + 1;
          dVar20 = 0.0;
          uVar8 = uVar15;
          uVar15 = uVar15 + 1;
        }
        if ((N != 4 || n != 1) || uVar6 != 0x24) {
          return N;
        }
        *local_108 = -1.0;
        local_108[1] = 0.0;
        local_108[2] = 1.0;
        local_108[3] = 0.0;
        return 4;
      }
      for (uVar13 = 1; uVar13 < uVar18; uVar13 = uVar13 + 2) {
        LP[uVar13] = 0.0;
      }
      uVar13 = (ulong)(N - 1);
      goto LAB_00620834;
    }
    break;
  case 4:
    if ((N & 1) == 0) break;
    local_d8 = dVar20;
    ON_Matrix::ON_Matrix(&Sbuffer);
    if (n < 6) {
      pdVar10 = (double *)0x0;
      pdVar19 = (double *)0x0;
      local_f0 = (double **)0x0;
    }
    else {
      bVar5 = ON_Matrix::Create(&Sbuffer,N + 2,N);
      if ((!bVar5) || (uVar6 = GetSubdivisionMatrix(this,Sbuffer.m,uVar18), N != uVar6)) {
        N = 0;
        ON_SubDIncrementErrorCount();
        goto LAB_006211c3;
      }
      pdVar19 = Sbuffer.m[uVar18];
      local_f0 = Sbuffer.m;
      pdVar10 = Sbuffer.m[N + 1];
    }
    eigenprecision[0] = 0.0;
    eigenprecision[1] = 0.0;
    eigenpivots[0] = 0.0;
    eigenpivots[1] = 0.0;
    eigenpivots[2] = 0.0;
    eigenvectors[0] = pdVar19;
    eigenvectors[1] = pdVar10;
    if (LP != (double *)0x0) {
      switch(n) {
      case 2:
        *LP = 0.25806451612903225;
        LP[1] = 0.3225806451612903;
        LP[2] = 0.04838709677419355;
        LP[3] = 0.3225806451612903;
        LP[4] = 0.04838709677419355;
        goto LAB_00620a31;
      case 3:
        lVar11 = 8;
        *LP = 12.789473684210526;
        uVar21 = 0x3ff86bca1af286bd;
        lVar28 = 0x20;
        uVar24 = 0x4019435e50d79436;
        lVar14 = 0x18;
        uVar25 = 0x3ff0000000000000;
        lVar17 = 0x10;
        uVar26 = 0x401b5e50d79435e5;
        break;
      case 4:
        lVar11 = 0x10;
        *LP = 25.93103448275862;
        LP[1] = 7.241379310344827;
        uVar21 = 0x4018d3dcb08d3dcb;
        lVar28 = 0x28;
        uVar24 = 0x3ff8469ee58469ee;
        lVar14 = 0x20;
        uVar25 = 0x401611a7b9611a7c;
        lVar17 = 0x18;
        uVar26 = 0x3ff0000000000000;
        break;
      case 5:
        lVar28 = 0x30;
        lVar14 = 0x28;
        lVar17 = 0x20;
        lVar11 = 0x18;
        *LP = 43.22276446246834;
        LP[1] = 7.4578211569974675;
        LP[2] = 1.0;
        uVar21 = 0x3ff87d519053b63a;
        uVar24 = 0x4016e72b46baaf08;
        uVar25 = 0x3ff7a263c23e3a58;
        uVar26 = 0x40145661dc7a3b62;
        break;
      default:
        if (local_f0 != (double **)0x0) {
          uVar6 = ON_GetEigenvectors(N,local_f0,true,1.0,1,(double *)0x0,eigenvectors,eigenprecision
                                     ,eigenpivots);
          if (uVar6 == 1) {
            if (*pdVar19 <= 0.0 && *pdVar19 != 0.0) {
              for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
                pdVar19[uVar13] = -pdVar19[uVar13];
              }
            }
            uVar13 = 0;
LAB_00621122:
            if (uVar18 != uVar13) goto code_r0x00621127;
            *LP = *pdVar19;
            LP[1] = pdVar19[1];
            uVar7 = N;
            for (uVar6 = 2; uVar7 = uVar7 - 1, uVar6 <= uVar7; uVar6 = uVar6 + 1) {
              dVar20 = pdVar19[uVar6];
              uVar13 = -(ulong)(pdVar19[uVar7] == dVar20);
              LP[uVar6] = (double)(uVar13 & (ulong)dVar20 |
                                  ~uVar13 & (ulong)((dVar20 + pdVar19[uVar7]) * 0.5));
            }
            if (2 < n) goto LAB_00620d38;
            goto LAB_00620a31;
          }
          ON_SubDIncrementErrorCount();
          goto LAB_006211c1;
        }
        goto LAB_0062110c;
      }
      *(undefined8 *)((long)LP + lVar11) = uVar26;
      *(undefined8 *)((long)LP + lVar17) = uVar25;
      *(undefined8 *)((long)LP + lVar14) = uVar24;
      *(undefined8 *)((long)LP + lVar28) = uVar21;
LAB_00620d38:
      pdVar16 = LP + (N - 1);
      for (pdVar12 = LP + 2; pdVar12 < pdVar16; pdVar12 = pdVar12 + 1) {
        *pdVar16 = *pdVar12;
        pdVar16 = pdVar16 + -1;
      }
      dVar20 = 0.0;
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        dVar20 = dVar20 + LP[uVar13];
      }
      for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
        LP[uVar13] = LP[uVar13] / dVar20;
      }
    }
LAB_00620a31:
    if (bVar3) goto LAB_006211c3;
    switch(n) {
    case 2:
      *L1 = 0.0;
      L1[1] = 0.0;
      L1[2] = -1.0;
      L1[3] = 0.0;
      L1[4] = 1.0;
      *local_108 = 4.0;
      lVar14 = 0x20;
      uVar21 = 0xc020000000000000;
      lVar17 = 0x18;
      uVar25 = 0xbff0000000000000;
      lVar11 = 0x10;
      uVar26 = 0x4018000000000000;
      lVar28 = 8;
      uVar24 = 0xbff0000000000000;
      goto LAB_00620fb6;
    case 3:
      *L1 = -2.25;
      L1[1] = -3.0;
      L1[2] = 0.5;
      L1[3] = 3.0;
      L1[4] = 0.75;
      L1[5] = 1.0;
      L1[6] = 0.0;
      *local_108 = 9.0;
      local_108[1] = 12.0;
      local_108[2] = -3.0;
      lVar14 = 0x30;
      lVar17 = 0x28;
      lVar11 = 0x20;
      lVar28 = 0x18;
      break;
    case 4:
      *L1 = -4.0;
      L1[1] = -7.0;
      L1[2] = 0.5;
      L1[3] = 3.0;
      L1[4] = 1.5;
      L1[5] = 4.0;
      L1[6] = 1.0;
      L1[7] = 1.0;
      L1[8] = 0.0;
      *local_108 = 16.0;
      local_108[1] = 28.0;
      local_108[2] = -3.0;
      local_108[3] = -16.0;
      local_108[4] = -7.0;
      lVar14 = 0x40;
      lVar17 = 0x38;
      lVar11 = 0x30;
      lVar28 = 0x28;
      break;
    case 5:
      *L1 = -6.25;
      L1[1] = -14.20820393249937;
      L1[2] = 0.5;
      L1[3] = 3.0;
      L1[4] = 1.9635254915624212;
      L1[5] = 5.854101966249685;
      L1[6] = 2.368033988749895;
      L1[7] = 4.618033988749895;
      L1[8] = 1.1545084971874737;
      L1[9] = 1.0;
      L1[10] = 0.0;
      *local_108 = 25.0;
      local_108[1] = 56.83281572999748;
      local_108[2] = -3.0;
      local_108[3] = -16.0;
      local_108[4] = -9.47213595499958;
      local_108[5] = -25.88854381999832;
      local_108[6] = -9.47213595499958;
      lVar14 = 0x50;
      lVar17 = 0x48;
      lVar11 = 0x40;
      lVar28 = 0x38;
      break;
    default:
      if (local_f0 == (double **)0x0) {
LAB_0062110c:
        ON_SubDIncrementErrorCount();
      }
      else {
        dVar20 = SubdominantEigenvalue(this);
        if ((dVar20 <= 0.0) || (1.0 <= dVar20)) {
          ON_SubDIncrementErrorCount();
        }
        else {
          uVar6 = ON_GetEigenvectors(N,local_f0,true,dVar20,2,(double *)0x0,eigenvectors,
                                     eigenprecision,eigenpivots);
          if (uVar6 == 2) {
            uVar6 = N - 2;
            dVar20 = pdVar19[uVar6];
            dVar22 = pdVar10[uVar6];
            uVar7 = N - 1;
            dVar1 = pdVar19[uVar7];
            dVar2 = pdVar10[uVar7];
            dVar27 = dVar20 * dVar2 - dVar1 * dVar22;
            if ((dVar27 != 0.0) || (NAN(dVar27))) {
              for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
                L1[uVar13] = pdVar19[uVar13] * (dVar2 / dVar27) +
                             pdVar10[uVar13] *
                             (double)(~-(ulong)(dVar1 == -dVar1) & (ulong)(-dVar1 / dVar27));
                local_108[uVar13] =
                     pdVar19[uVar13] *
                     (double)(~-(ulong)(dVar22 == 0.0) & (ulong)(-dVar22 / dVar27)) +
                     pdVar10[uVar13] * (dVar20 / dVar27);
              }
              for (uVar13 = 0; uVar18 != uVar13; uVar13 = uVar13 + 1) {
                dVar20 = L1[uVar13];
                dVar22 = floor(dVar20 + 0.49);
                if (ABS(dVar22 - dVar20) <= 1e-12) {
                  L1[uVar13] = dVar22;
                }
                dVar20 = local_108[uVar13];
                dVar22 = floor(dVar20 + 0.49);
                if (ABS(dVar22 - dVar20) <= 1e-12) {
                  local_108[uVar13] = dVar22;
                }
              }
              *L1 = local_d8 * -0.25 * local_d8;
              L1[uVar6] = 1.0;
              L1[uVar7] = 0.0;
              *local_108 = (double)(n * n);
              local_108[2] = -3.0;
              local_108[3] = -16.0;
              local_108[N - 4] = -16.0;
              local_108[N - 3] = -3.0;
              local_108[uVar6] = 0.0;
              local_108[uVar7] = 1.0;
              uVar13 = (ulong)(N - 5);
              for (uVar18 = 4; uVar18 < uVar13; uVar18 = uVar18 + 1) {
                dVar20 = local_108[uVar18];
                dVar22 = local_108[uVar13];
                if ((dVar20 != dVar22) || (NAN(dVar20) || NAN(dVar22))) {
                  dVar20 = (dVar20 + dVar22) * 0.5;
                  local_108[uVar18] = dVar20;
                  local_108[uVar13] = dVar20;
                }
                uVar13 = uVar13 - 1;
              }
              goto LAB_006211c3;
            }
          }
          else {
            ON_SubDIncrementErrorCount();
          }
        }
      }
      goto LAB_006211c1;
    }
    uVar21 = 0;
    uVar26 = 0xc030000000000000;
    uVar25 = 0xc008000000000000;
    uVar24 = 0x3ff0000000000000;
LAB_00620fb6:
    *(undefined8 *)((long)local_108 + lVar28) = uVar26;
    *(undefined8 *)((long)local_108 + lVar11) = uVar25;
    *(undefined8 *)((long)local_108 + lVar17) = uVar21;
    *(undefined8 *)((long)local_108 + lVar14) = uVar24;
LAB_006211c3:
    ON_Matrix::~ON_Matrix(&Sbuffer);
    return N;
  }
LAB_00620545:
  ON_SubDIncrementErrorCount();
  return 0;
code_r0x00621127:
  pdVar12 = pdVar19 + uVar13;
  uVar13 = uVar13 + 1;
  if (*pdVar12 <= 0.0 && *pdVar12 != 0.0) goto LAB_00621134;
  goto LAB_00621122;
LAB_00621134:
  ON_SubDIncrementErrorCount();
LAB_006211c1:
  N = 0;
  goto LAB_006211c3;
}

Assistant:

unsigned int ON_SubDSectorType::GetSurfaceEvaluationCoefficients(
  double* LP,
  size_t LP_capacity,
  double* L1,
  size_t L1_capacity,
  double* L2,
  size_t L2_capacity
  ) const
{
  const double lambda = SubdominantEigenvalue();
  if (!(lambda > 0.0 && lambda < 1.0))
    return ON_SUBD_RETURN_ERROR(0);

  
  const unsigned int R = PointRingCount();
  if (R < 3)
    return ON_SUBD_RETURN_ERROR(0);

  const unsigned int F = FaceCount();
  if (F < 1)
    return ON_SUBD_RETURN_ERROR(0);
  const double dF = F;

  if ( 0 == LP_capacity)
    LP = nullptr;
  else if (LP_capacity < R || nullptr == LP)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if ( 0 == L1_capacity)
    L1 = nullptr;
  else if (L1_capacity < R || nullptr == L1)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if ( 0 == L2_capacity)
    L2 = nullptr;
  else if (L2_capacity < R || nullptr == L2)
  {
    return ON_SUBD_RETURN_ERROR(0);
  }

  if (nullptr == L1 || nullptr == L2)
  {
    // If one of L1 or L2 is null, then both must be null.
    if (nullptr != L1 || nullptr != L2)
    {
      return ON_SUBD_RETURN_ERROR(0);
    }
  }

  double p, q, y, z, cos0, cos1, sin0, sin1;
  bool b180degreeCorner = false;

  switch (VertexTag())
  {
  case ON_SubDVertexTag::Unset:
    break;

  case ON_SubDVertexTag::Smooth:
    if (R >= 5 && 1 == (R % 2))
    {
      if (nullptr != LP)
      {
        // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Smooth
        //
        // General case code works for R = 5 case: LP[5] = {2/7, 2/7, 1/14, 2/7, 1/14};
        LP[0] = dF / (5.0 + dF); // center point coefficient
        y = dF * (dF + 5.0);
        p = 4.0 / y; // edge point coefficient
        q = 1.0 / y; // face point coefficient
        for (unsigned int i = 1; i < R; i++)
        {
          LP[i] = p;
          i++;
          LP[i] = q;
        }
      }

      if (nullptr != L1)
      {
        if (5 == R)
        {
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Smooth
          //
          // Evaluation matrix has eigenvalues 1, 1/4, 1/4, -1/4, 1/8,
          // so we have a well defined limit point and 3 subdominant eigenvalues. 
          // The 1 eigenspace is 1 dimensional and spanned by (1,1,1,1,1).
          // The 1/4 eigenspace is 2 dimensional and spanned by (0,1,0,-1,0) and (0,0,1,0,-1).
          // The -1/4 eigenspace is 1 dimensional and spanned by (2,-1,0,-1,0).
          // The 1/8 is 1 dimensional and spanned by (1,1,-6,1,-6).
          // The general case code below will divide by zero when y is evaluated because cos1 = -1.
          // Turns out there is 1 well defined tangent vector (Q1-Q0) (quad points)

          // This is a "pseudo" limit tangent
          L1[0] = 0.0;
          L1[1] = 1.0;
          L1[2] = 0.0;
          L1[3] = -1.0;
          L1[4] = 0.0;

          // This is a bonafide limit tangent
          L2[0] = 0.0;
          L2[1] = 0.0;
          L2[2] = 1.0;
          L2[3] = 0.0;
          L2[4] = -1.0;
        }
        else
        {
          // cos0 = cos(2pi * 0/F)
          // sin0 = sin(2pi * 0/F)
          // cos1 = cos(2pi * 1/F)
          // sin1 = sin(2pi * 1/F)
          cos0 = 1.0;
          sin0 = 0.0;
          ON_SubDMatrix::EvaluateCosAndSin(2, F, &cos1, &sin1);
          y = 2.0* (lambda - 0.125*(3.0 + cos1)) / (1.0 + cos1);
          L1[0] = 0.0;
          L1[1] = cos0;
          L2[0] = 0.0;
          L2[1] = sin0;
          unsigned int i = 2;
          for (;;)
          {
            L1[i] = y * (cos0 + cos1);
            L2[i] = y * (sin0 + sin1);
            i++;
            if (i == R)
              break;
            L1[i] = cos1;
            L2[i] = sin1;
            i++;
            cos0 = cos1;
            sin0 = sin1;
            ON_SubDMatrix::EvaluateCosAndSin(i, F, &cos1, &sin1);
            // E0[] and E1[] values are symmetric and we could stop halfway and copy
            // current loop debugged and tested Feb 10, 2015
          }
        }
      }
      return R;
    }
    break;

  case ON_SubDVertexTag::Dart:
    if (1 == (R % 2))
    {
      ON_Matrix Sbuffer;
      const double*const* S = nullptr;
      double* E1 = nullptr;
      double* E2 = nullptr;
      if (F > 5)
      {
        if (false == Sbuffer.Create(R+2,R))
          return ON_SUBD_RETURN_ERROR(0);
        if (R != ON_SubDSectorType::GetSubdivisionMatrix(Sbuffer.m, R))
          return ON_SUBD_RETURN_ERROR(0);
        S = Sbuffer.m;
        E1 = Sbuffer.m[R];
        E2 = Sbuffer.m[R+1];
      }
      const double* termination_tolerances = nullptr;
      double* eigenvectors[2] = { E1, E2 };
      double eigenprecision[2] = { 0 };
      double eigenpivots[3] = { 0 };

      if (nullptr != LP)
      {
        switch (F)
        {
        case 2:
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Dart
          //
          // Evaluation matrix is 5x5 with has eigenvalues 1, 1/2, 1/4, sqrt(2)/8, - sqrt(2)/8.
          LP[0] = 8.0 / 31.0;
          LP[1] = 10.0 / 31.0;
          LP[2] = 3.0 / 62.0;
          LP[3] = 10.0 / 31.0;
          LP[4] = 3.0 / 62.0;
          break;

        case 3:
          LP[0] = 243/19.0;
          LP[1] = 130/19.0;
          LP[2] = 1.0;
          LP[3] = 120/19.0;
          LP[4] = 29/19.0;
          //LP[5] = 120/19.0;
          //LP[6] = 1.0;
          break;
        case 4:
          LP[0] = 752/29.0;
          LP[1] = 210/29.0;
          LP[2] = 1.0;
          LP[3] = 160/29.0;
          LP[4] = 44/29.0;
          LP[5] = 180/29.0; 
          //LP[6] = 44/29.0;
          //LP[7] = 160/29.0;
          //LP[8] = 1.0;
          break;
        case 5:
          LP[0] = 43.222764462468341719; 
          LP[1] = 7.4578211569974673376; 
          LP[2] = 1.0;
          LP[3] = 5.0843576860050653249; 
          LP[4] = 1.4771459186191773181; 
          LP[5] = 5.7257510234301278178;
          LP[6] = 1.5305953634045991926;
          //LP[7] = 5.7257510234301278178; 
          //LP[8] = 1.4771459186191773181;
          //LP[9] = 5.0843576860050653249;
          //LP[10] = 1.0000000000000000000;
          break;
        default:
          {
            // TODO
            // Finish general case formula for dominant eigenvector of Transpose(S)
            // Until I derive the formula, I can get the dominant eigenvector as the kernel of the matrix (S - I).
            // This calculation has plenty of precision, but it's a less elegant way to get the solution.
            if (nullptr == S)
              return ON_SUBD_RETURN_ERROR(0);
            const double lambda_local = 1.0;
            const unsigned int lambda_multiplicity = 1;
            if (lambda_multiplicity != ON_GetEigenvectors(R, S, true, lambda_local, lambda_multiplicity, termination_tolerances, eigenvectors, eigenprecision, eigenpivots))
              return ON_SUBD_RETURN_ERROR(0);
            if (E1[0] < 0.0)
            {
              for ( unsigned int i = 0; i < R; i++ )
                E1[i] = -E1[i];
            }
            for (unsigned int i = 0; i < R; i++)
            {
              if (E1[i] < 0.0)
                return ON_SUBD_RETURN_ERROR(0);
            }
            LP[0] = E1[0];
            LP[1] = E1[1];
            unsigned int i0 = 2;
            unsigned int i1 = R-1;
            while (i0 <= i1)
            {
              LP[i0] = (E1[i0] == E1[i1]) ? E1[i0] : 0.5*(E1[i0] + E1[i1]);
              i0++;
              i1--;
            }
          }
          break;
        }

        if (F >= 3)
        {
          // The code below works for all F >= 3.
          const double* q0 = &LP[2];
          double* q1 = &LP[R - 1];
          while (q0 < q1)
            *q1-- = *q0++;
          double LPsum = 0.0;
          for (unsigned int i = 0; i < R; i++)
            LPsum += LP[i];
          for (unsigned int i = 0; i < R; i++)
            LP[i] /= LPsum;
        }
      }

      if (nullptr != L1)
      {
        switch (F)
        {
        case 2:
          // April 2019 Dale Lear - Catmull Clark Valence 2 Evaluation: Dart
          //
          // Evaluation matrix is 5x5 with has eigenvalues 1, 1/2, 1/4, sqrt(2)/8, - sqrt(2)/8.
          // The multiplicity of the subdominant eigen value is 1/2 and there is a single well defined
          // tangent in the limit surface. The other is a "fake" tangent that is close enough.

          // This is pseudo tangent associated with the eigenvalue 1/4
          // (1/4)^n goes to zero much faster than (1/2)^n, but ...
          // If the 5 points were translated so the limit point was zero 
          // and then a rotation about the origin were applied so bonafide limit tangent
          // was parallel to the x-axis (L2*(C,P0,Q0,P1,P1) = 0), then, as n goes to infinity,
          // Q0 - Q1 would be the farthest point from the x-axis.
          // the 5 
          L1[0] = 0.0;
          L1[1] = 0.0;
          L1[2] = -1.0;
          L1[3] = 0.0;
          L1[4] = 1.0;

          // This is a bonafide limit tangent associated with the eigenvalue 1/2.
          // I
          L2[0] = 4.0; // 2^2
          L2[1] = 6.0; 
          L2[2] = -1.0; 
          L2[3] = -8.0;
          L2[4] = -1.0;
          break;

        case 3:
          L1[0] = -9/4.0; // -L2[0]/4
          L1[1] = -3.0;
          L1[2] = 1/2.0;
          L1[3] = 3.0; 
          L1[4] = 3/4.0;
          L1[5] = 1;
          L1[6] = 0;

          L2[0] = 9.0; // 3^2
          L2[1] = 12.0; 
          L2[2] =  -3; 
          L2[3] = -16;  // -16  // -3, -16 = L2[3] = -16, -3
          L2[4] =  -3;  //  -3
          L2[5] = 0; 
          L2[6] = 1;
          break;

        case 4:
          L1[0] = -4.0;  // -L2[0]/4
          L1[1] = -7.0; 
          L1[2] = 1/2.0; 
          L1[3] = 3.0; 
          L1[4] = 3/2.0; 
          L1[5] = 4.0; 
          L1[6] = 1.0; 
          L1[7] = 1; 
          L1[8] = 0;

          L2[0] = 16.0; // 4^2
          L2[1] = 28.0;
          L2[2] =  -3;
          L2[3] = -16;
          L2[4] = -7.0;   // -3, -16, L2[4], -16, -3
          L2[5] = -16; 
          L2[6] =  -3;
          L2[7] = 0;
          L2[8] = 1;
          break;

        case 5:
          L1[0] = -6.25; // -L2[0]/4
          L1[1] = -14.208203932499369089;
          L1[2] = 0.50000000000000000000;
          L1[3] = 3.0000000000000000000;
          L1[4] = 1.9635254915624211362;
          L1[5] = 5.8541019662496845446;
          L1[6] = 2.3680339887498948482; 
          L1[7] = 4.6180339887498948482;
          L1[8] = 1.1545084971874737121;
          L1[9]  = 1;
          L1[10] = 0;

          L2[0] = 25.0; // 5^2
          L2[1] = 56.832815729997476357;
          L2[2] =  -3;
          L2[3] = -16;
          L2[4] = -9.4721359549995793928;
          L2[5] = -25.888543819998317571; // -3, -16, ..., L2[5], ..., -16, -3
          L2[6] = -9.4721359549995793928;
          L2[7] = -16; // -16 
          L2[8] =  -3; //  -3
          L2[9]  = 0;
          L2[10] = 1;
          break;

        default:
          {
            // TODO
            // Finish general case formula for subdominant eigenvectors of Transpose(S)
            // Until I derive the formula, I can get the subdominant eigenvectors as the kernel of the matrix (S - 1/2*I).
            // This calculation has plenty of precision, but it's a less elegant way to get the solution.
            if (nullptr == S)
              return ON_SUBD_RETURN_ERROR(0);
            const double lambda_local = SubdominantEigenvalue();
            if (!(lambda_local > 0.0 && lambda_local < 1.0))
              return ON_SUBD_RETURN_ERROR(0);
            const unsigned int lambda_multiplicity = 2;
            if (lambda_multiplicity != ON_GetEigenvectors(R, S, true, lambda_local, lambda_multiplicity, termination_tolerances, eigenvectors, eigenprecision, eigenpivots))
              return ON_SUBD_RETURN_ERROR(0);

            const double E[2][2] = { { E1[R - 2], E2[R - 2] }, { E1[R - 1], E2[R - 1] } };

            const double det = E[0][0] * E[1][1] - E[0][1] * E[1][0];
            if (!(0.0 != det))
              return 0;

            const double EtoL[2][2] = {
              { E[1][1] / det, (0.0 == E[0][1]) ? 0.0 : (-E[0][1] / det) },
              { (0.0 == E[1][0]) ? 0.0 : (-E[1][0] / det), E[0][0] / det } };

            for (unsigned int i = 0; i < R; i++)
            {
              L1[i] = E1[i] * EtoL[0][0] + E2[i] * EtoL[1][0];
              L2[i] = E1[i] * EtoL[0][1] + E2[i] * EtoL[1][1];
            }

            const double int_tol = 1e-12;
            double x;
            for (unsigned int i = 0; i < R; i++)
            {
              x = floor(L1[i]+0.49);
              if (fabs(x - L1[i]) <= int_tol)
                L1[i] = x;
              x = floor(L2[i]+0.49);
              if (fabs(x - L2[i]) <= int_tol)
                L2[i] = x;
            }

            L1[0]     = -0.25*F*F;
            L1[R - 2] = 1.0;
            L1[R - 1] = 0.0;

            L2[0]   = F*F;
            L2[2]   = -3.0;
            L2[3]   = -16.0;
            L2[R-4] = -16.0;
            L2[R-3] =  -3.0;
            L2[R-2] =   0.0;
            L2[R-1] =   1.0;

            // L2[2, ..., R-1] is symmetric about L2[2+R/2]
            unsigned int i0 = 4;
            unsigned int i1 = R - 5;
            while (i0 < i1)
            {
              if (L2[i0] != L2[i1])
              {
                x = 0.5*(L2[i0] + L2[i1]);
                L2[i0] = x;
                L2[i1] = x;
              }
              i0++;
              i1--;
            }
          }
          break;
        }
      }
      return R;
    }
    break;


  case ON_SubDVertexTag::Corner:
    if (0 == (R % 2))
    {
      const unsigned int angle_index = CornerSectorAngleIndex();
      if ( 36 == angle_index && F > 1)
        b180degreeCorner = true; // use crease calculation
      else
      {
        // the corner angle alpha is not equal to pi (180 degrees)
        // so limit tangents will not be parallel
        // Lpev[]
        LP[0] = 1.0; // center point coefficient
        for (unsigned int i = 1; i < R; i++)
          LP[i++] = 0.0; // all face and edge coefficients = 0

        L1[0] = -1.0; // center point coefficient
        L1[1] = 1.0; // initial boundary edge point coefficient
        L1[R - 1] = 0.0; // final boundary edge point coefficient

        // The sign of s is selected to keep the normal pointing "up".
        double s = (2 * angle_index <= ON_SubDSectorType::MaximumCornerAngleIndex) ? 1.0 : -1.0;
        L2[0] = -s; // center point coefficient
        L2[1] = 0.0; // initial boundary edge point coefficient
        L2[R - 1] = s; // final boundary edge point coefficient
        for (unsigned int i = 2; i + 1 < R; i++)
        {
          L1[i] = 0.0; // all face and interior edge coefficients = 0
          L2[i] = 0.0; // all face and interior edge coefficients = 0
        }

        if (36 == angle_index && 1 == F && 4 == R)
        {
          // This case has no good solution.
          L2[0] = -1.0;
          L2[1] = 0.0;
          L2[2] = 1.0;
          L2[3] = 0.0;
        }

        // TODO deal with 180 degree "corner case".  
        // L0 and L1 are the same as above. L2 will be similar to the crease case
        return R;
      }
    }
    if ( false == b180degreeCorner)
      break;

  case ON_SubDVertexTag::Crease:
    // NOTE: In the case when there are 2 crease edes and a single face,
    // The Catmull-Clark subdivision matrix is singular.
    if (0 == (R % 2))
    {
      // Lpev[]
      if (b180degreeCorner)
      {
        LP[0] = 1.0; // center point coefficient
        for (unsigned int i = 1; i < R; i++)
          LP[i++] = 0.0; // all face and edge coefficients = 0
      }
      else
      {
        LP[0] = 2.0 / 3.0; // center point coefficient
        LP[1] = LP[R - 1] = 1.0 / 6.0;  // boundary edge point coefficients
        for (unsigned int i = 2; i + 1 < R; i++)
          LP[i++] = 0.0; // all face and interior edge coefficients = 0
      }

      // Using L1[] computes the tangent to the crease curve. This
      // curve is a uniform cubic spline with control points
      // (..., final crease edge point, center point, initial crease edge point, ...)
      L1[  0] =  0.0; // center point coefficient
      L1[  1] =  1.0; // initial boundary edge point coefficient
      L1[R-1] = -1.0; // final boundary edge point coefficient
      for (unsigned int i = 2; i+1 < R; i++)
        L1[i] = 0.0; // all face and interior edge coefficients = 0

      // Using L2[] computes a tangent that points from the limit point
      // into the subdivision surface.
      if (1 == F)
      {
        // This is the special where IsCatmullClarkCreaseOneFaceCase() returns true.
        // Catmull-Clark subdivision,
        // center vertex is a crease vertex,
        // one face and two crease edges.
        L2[0] = -2.0; // center point coefficients
        L2[1] =  1.0; // boundary edge point coefficient
        L2[2] =  0.0; // face point coefficient
        L2[3] =  1.0; // boundary edge point coefficient
      }
      else
      {
        // F faces, F-1 interior smooth edges and 2 boundary edges
        // theta = pi/F
        cos0 = 1.0; // cos(0)
        sin0 = 0.0; // sin(0)
        ON_SubDMatrix::EvaluateCosAndSin(1,F,&cos1,&sin1); // cos1 = cos(pi/F), sin1 = sin(pi/F)
        z = (1.0 + cos1) / sin1;
        L2[0] = -sin1;  // center point coefficients
        L2[1] = -0.25*z*(1.0 + 2.0*cos1); // initial boundary edge point coefficient
        L2[2] = 0.25*(sin0 + sin1); // first interior face point coefficient
        L2[R-1] = L2[1];            // final boundary edge point coefficient
        unsigned int i = 3;
        for (;;)
        {
          cos0 = cos1;
          sin0 = sin1;
          ON_SubDMatrix::EvaluateCosAndSin(i/2 + 1, F, &cos1, &sin1);
          L2[i] = sin0; // interior edge point coefficient
          i++;
          L2[i] = 0.25*(sin0 + sin1); // interior face point coefficient
          i++;
          if ( i >= R-1 )
            break;
        }
      }

      return R;
    }
    break;
  }

  return ON_SUBD_RETURN_ERROR(0);
}